

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::
     MatchPrintAndExplain<phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const,phmap::parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>const&>
               (parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>
                *value,Matcher<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                       *matcher,MatchResultListener *listener)

{
  anon_union_8_1_a8a14541_for_iterator_1 ptr;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  type_info *type;
  long lVar4;
  const_iterator __begin0;
  const_iterator local_1f8;
  StringMatchResultListener inner_listener;
  
  if (listener->stream_ == (ostream *)0x0) {
    bVar1 = MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
            ::Matches(&matcher->
                       super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                      ,value);
    return bVar1;
  }
  StringMatchResultListener::StringMatchResultListener(&inner_listener);
  bVar1 = MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
          ::MatchAndExplain(&matcher->
                             super_MatcherBase<const_phmap::parallel_flat_hash_set<std::unique_ptr<int,_std::default_delete<int>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_4UL,_phmap::NullMutex>_&>
                            ,value,&inner_listener.super_MatchResultListener);
  poVar3 = listener->stream_;
  std::operator<<(poVar3,'{');
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  ::begin(&__begin0,
          &value->
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
         );
  local_1f8.iter_.it_.ctrl_ = (ctrl_t *)0x0;
  local_1f8.iter_.inner_ = (Inner *)0x0;
  local_1f8.iter_.inner_end_ = (Inner *)0x0;
  local_1f8.iter_.it_end_.ctrl_ = (ctrl_t *)0x0;
  lVar4 = 0;
  do {
    bVar2 = phmap::priv::operator!=(&__begin0,&local_1f8);
    ptr = __begin0.iter_.it_.field_1;
    if (!bVar2) {
      if (lVar4 != 0) {
LAB_0012110e:
        std::operator<<(poVar3,' ');
      }
      std::operator<<(poVar3,'}');
      GetTypeName_abi_cxx11_
                ((string *)&__begin0,
                 (internal *)
                 &phmap::
                  parallel_flat_hash_set<std::unique_ptr<int,std::default_delete<int>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>,4ul,phmap::NullMutex>
                  ::typeinfo,type);
      bVar2 = IsReadableTypeName((string *)&__begin0);
      if (bVar2) {
        poVar3 = std::operator<<(listener->stream_," (of type ");
        poVar3 = std::operator<<(poVar3,(string *)&__begin0);
        std::operator<<(poVar3,")");
      }
      std::__cxx11::stringbuf::str();
      PrintIfNotEmpty((string *)&local_1f8,listener->stream_);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&__begin0);
      StringMatchResultListener::~StringMatchResultListener(&inner_listener);
      return bVar1;
    }
    if ((lVar4 != 0) && (std::operator<<(poVar3,','), lVar4 == 0x20)) {
      std::operator<<(poVar3," ...");
      goto LAB_0012110e;
    }
    std::operator<<(poVar3,' ');
    PrintTo<int,std::default_delete<int>>(ptr.slot_,poVar3);
    lVar4 = lVar4 + 1;
    phmap::priv::
    parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ::const_iterator::operator++(&__begin0);
  } while( true );
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}